

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_err_t * mpca_lang_contents(int flags,char *filename,...)

{
  char in_AL;
  FILE *__stream;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined4 in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  FILE *in_XMM0_Qa;
  char *in_XMM0_Qb;
  mpc_input_t *unaff_retaddr;
  FILE *f;
  va_list va;
  mpc_err_t *err;
  mpc_input_t *i;
  mpca_grammar_st_t st;
  undefined1 auStack_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  FILE *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  undefined4 local_68;
  undefined4 local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  mpc_err_t *local_48;
  mpc_input_t *local_40;
  undefined4 *local_38;
  undefined4 local_30;
  void *local_28;
  undefined4 local_20;
  char *local_18;
  undefined4 local_c;
  mpca_grammar_st_t *in_stack_fffffffffffffff8;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff08 = in_XMM0_Qa;
    in_stack_ffffffffffffff10 = in_XMM0_Qb;
  }
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  local_18 = in_RSI;
  local_c = in_EDI;
  __stream = fopen(in_RSI,"rb");
  if (__stream == (FILE *)0x0) {
    local_48 = mpc_err_file(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  }
  else {
    local_60 = &stack0x00000008;
    local_64 = 0x30;
    local_68 = 0x10;
    local_38 = &local_68;
    local_30 = 0;
    local_28 = (void *)0x0;
    local_20 = local_c;
    local_58 = auStack_128;
    local_40 = mpc_input_new_file(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_48 = mpca_lang_st(unaff_retaddr,in_stack_fffffffffffffff8);
    mpc_input_delete((mpc_input_t *)0x29e2cb);
    free(local_28);
    fclose(__stream);
  }
  return local_48;
}

Assistant:

mpc_err_t *mpca_lang_contents(int flags, const char *filename, ...) {

  mpca_grammar_st_t st;
  mpc_input_t *i;
  mpc_err_t *err;

  va_list va;

  FILE *f = fopen(filename, "rb");

  if (f == NULL) {
    err = mpc_err_file(filename, "Unable to open file!");
    return err;
  }

  va_start(va, filename);

  st.va = &va;
  st.parsers_num = 0;
  st.parsers = NULL;
  st.flags = flags;

  i = mpc_input_new_file(filename, f);
  err = mpca_lang_st(i, &st);
  mpc_input_delete(i);

  free(st.parsers);
  va_end(va);

  fclose(f);

  return err;
}